

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_is_zero(secp256k1_fe *a)

{
  uint64_t *t;
  secp256k1_fe *a_local;
  
  return (int)((((a->n[0] == 0 && a->n[1] == 0) && a->n[2] == 0) && a->n[3] == 0) && a->n[4] == 0);
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_zero(const secp256k1_fe *a) {
    const uint64_t *t = a->n;
#ifdef VERIFY
    VERIFY_CHECK(a->normalized);
    secp256k1_fe_verify(a);
#endif
    return (t[0] | t[1] | t[2] | t[3] | t[4]) == 0;
}